

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<duckdb::hugeint_t,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  RLEScanState<duckdb::hugeint_t> *scan_state;
  ulong uVar4;
  ulong uVar5;
  uint64_t *puVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  hugeint_t *data_pointer;
  rle_count_t *index_pointer;
  hugeint_t element;
  
  scan_state = (RLEScanState<duckdb::hugeint_t> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (hugeint_t *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<duckdb::hugeint_t>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar8 = scan_count + result_offset;
  do {
    uVar4 = uVar8 - result_offset;
    if (uVar8 < result_offset || uVar4 == 0) {
      return;
    }
    uVar5 = (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry;
    uVar2 = data_pointer[scan_state->entry_pos].lower;
    uVar3 = data_pointer[scan_state->entry_pos].upper;
    if (uVar4 < uVar5) {
      puVar6 = (uint64_t *)(pdVar1 + result_offset * 0x10);
      lVar10 = uVar4 + (uVar4 == 0);
      do {
        *puVar6 = uVar2;
        puVar6[1] = uVar3;
        puVar6 = puVar6 + 2;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      iVar7 = scan_state->position_in_entry + uVar4;
    }
    else {
      if ((ulong)index_pointer[scan_state->entry_pos] != scan_state->position_in_entry) {
        puVar6 = (uint64_t *)(pdVar1 + result_offset * 0x10);
        uVar9 = uVar5;
        do {
          *puVar6 = uVar2;
          puVar6[1] = uVar3;
          puVar6 = puVar6 + 2;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      result_offset = result_offset + uVar5;
      scan_state->entry_pos = scan_state->entry_pos + 1;
      iVar7 = 0;
    }
    scan_state->position_in_entry = iVar7;
  } while (uVar5 <= uVar4);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}